

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap.cpp
# Opt level: O2

void Omega_h::filter_swap(Read<signed_char> *keep_cands,LOs *cands2edges,Reals *cand_quals)

{
  LOs kept2old;
  Write<double> local_98;
  Write<int> local_88;
  Write<double> local_78;
  Write<int> local_68;
  Write<int> local_58;
  Write<int> local_48;
  Write<int> local_38;
  Write<signed_char> local_28;
  
  Write<signed_char>::Write(&local_28,&keep_cands->write_);
  collect_marked((Omega_h *)&kept2old,(Read<signed_char> *)&local_28);
  Write<signed_char>::~Write(&local_28);
  Write<int>::Write(&local_58,&kept2old.write_);
  Write<int>::Write(&local_68,&cands2edges->write_);
  unmap<int>((Omega_h *)&local_48,(LOs *)&local_58,(Read<int> *)&local_68,1);
  Read<int>::Read((Read<signed_char> *)&local_38,&local_48);
  Write<int>::operator=(&cands2edges->write_,&local_38);
  Write<int>::~Write(&local_38);
  Write<int>::~Write(&local_48);
  Write<int>::~Write(&local_68);
  Write<int>::~Write(&local_58);
  if (cand_quals != (Reals *)0x0) {
    Write<int>::Write(&local_88,&kept2old.write_);
    Write<double>::Write(&local_98,&cand_quals->write_);
    unmap<double>((Omega_h *)&local_78,(LOs *)&local_88,(Read<signed_char> *)&local_98,1);
    Read<double>::Read((Read<signed_char> *)&local_38,&local_78);
    Write<double>::operator=(&cand_quals->write_,(Write<signed_char> *)&local_38);
    Write<double>::~Write((Write<double> *)&local_38);
    Write<double>::~Write(&local_78);
    Write<double>::~Write(&local_98);
    Write<int>::~Write(&local_88);
  }
  Write<int>::~Write(&kept2old.write_);
  return;
}

Assistant:

void filter_swap(Read<I8> keep_cands, LOs* cands2edges, Reals* cand_quals) {
  auto kept2old = collect_marked(keep_cands);
  *cands2edges = unmap(kept2old, *cands2edges, 1);
  if (cand_quals) *cand_quals = unmap(kept2old, *cand_quals, 1);
}